

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O3

ON_aStringHeader * __thiscall ON_String::IncrementedHeader(ON_String *this)

{
  ON_Internal_Empty_aString *pOVar1;
  
  if ((this->m_s != (char *)0x0) &&
     (pOVar1 = (ON_Internal_Empty_aString *)(this->m_s + -0xc), pOVar1 != &empty_astring)) {
    LOCK();
    (pOVar1->header).ref_count.super___atomic_base<int>._M_i =
         (pOVar1->header).ref_count.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    return (ON_aStringHeader *)pOVar1;
  }
  return (ON_aStringHeader *)0x0;
}

Assistant:

ON_aStringHeader* ON_String::IncrementedHeader() const
{
  ON_aStringHeader* hdr = (ON_aStringHeader*)m_s;
  if (nullptr == hdr)
    return nullptr;
  
  hdr--;
  if (hdr == pEmptyStringHeader)
    return nullptr;

  //ON_AtomicIncrementInt32(&hdr->ref_count);
  ++hdr->ref_count;
  return hdr;
}